

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::BatchnormLayerParams::SharedDtor(BatchnormLayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  LogMessage *other;
  undefined8 *puVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if (puVar3 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x646b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
    pWVar2 = this->gamma_;
    if (pWVar2 != (WeightParams *)0x0) {
      WeightParams::~WeightParams(pWVar2);
      operator_delete(pWVar2,0x48);
    }
    if (this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
      pWVar2 = this->beta_;
      if (pWVar2 != (WeightParams *)0x0) {
        WeightParams::~WeightParams(pWVar2);
        operator_delete(pWVar2,0x48);
      }
      if (this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) {
        pWVar2 = this->mean_;
        if (pWVar2 != (WeightParams *)0x0) {
          WeightParams::~WeightParams(pWVar2);
          operator_delete(pWVar2,0x48);
        }
        if ((this != (BatchnormLayerParams *)_BatchnormLayerParams_default_instance_) &&
           (pWVar2 = this->variance_, pWVar2 != (WeightParams *)0x0)) {
          WeightParams::~WeightParams(pWVar2);
          operator_delete(pWVar2,0x48);
        }
      }
    }
  }
  return;
}

Assistant:

inline void BatchnormLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete gamma_;
  if (this != internal_default_instance()) delete beta_;
  if (this != internal_default_instance()) delete mean_;
  if (this != internal_default_instance()) delete variance_;
}